

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O1

_Bool xdr_nreplymsg(XDR *xdrs,rpc_msg *rmsg)

{
  uint *puVar1;
  msg_type *pmVar2;
  reply_body *prVar3;
  xdr_discrim *pxVar4;
  xdr_op xVar5;
  uint uVar6;
  msg_type mVar7;
  reply_stat rVar8;
  _Bool _Var9;
  code *UNRECOVERED_JUMPTABLE;
  xdrproc_t *pp_Var10;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x90,"_Bool xdr_nreplymsg(XDR *, struct rpc_msg *)");
  }
  if (rmsg == (rpc_msg *)0x0) {
    __assert_fail("rmsg != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x91,"_Bool xdr_nreplymsg(XDR *, struct rpc_msg *)");
  }
  xVar5 = xdrs->x_op;
  if (xVar5 != XDR_FREE) {
    if (xVar5 == XDR_DECODE) {
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar1) {
        _Var9 = (*xdrs->x_ops->x_getunit)(xdrs,&rmsg->rm_xid);
        goto LAB_00111167;
      }
      uVar6 = *(uint *)xdrs->x_data;
      rmsg->rm_xid = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18
      ;
      xdrs->x_data = (uint8_t *)puVar1;
    }
    else {
      if (xVar5 != XDR_ENCODE) {
        return false;
      }
      uVar6 = rmsg->rm_xid;
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar1) {
        _Var9 = (*xdrs->x_ops->x_putunit)(xdrs,uVar6);
LAB_00111167:
        if (_Var9 == false) {
          return false;
        }
      }
      else {
        *(uint *)xdrs->x_data =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
      }
    }
  }
  pmVar2 = &rmsg->rm_direction;
  xVar5 = xdrs->x_op;
  if (xVar5 != XDR_FREE) {
    if (xVar5 == XDR_DECODE) {
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar1) {
        _Var9 = (*xdrs->x_ops->x_getunit)(xdrs,pmVar2);
        goto LAB_001111d3;
      }
      uVar6 = *(uint *)xdrs->x_data;
      *pmVar2 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      xdrs->x_data = (uint8_t *)puVar1;
    }
    else {
      if (xVar5 != XDR_ENCODE) {
        return false;
      }
      mVar7 = *pmVar2;
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar1) {
        _Var9 = (*xdrs->x_ops->x_putunit)(xdrs,mVar7);
LAB_001111d3:
        if (_Var9 == false) {
          return false;
        }
      }
      else {
        *(msg_type *)xdrs->x_data =
             mVar7 >> 0x18 | (mVar7 & 0xff0000) >> 8 | (mVar7 & 0xff00) << 8 | mVar7 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
      }
    }
  }
  if (*pmVar2 != REPLY) {
    return false;
  }
  prVar3 = &(rmsg->ru).RM_rmb;
  xVar5 = xdrs->x_op;
  if (xVar5 != XDR_FREE) {
    if (xVar5 == XDR_DECODE) {
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if (puVar1 <= (xdrs->x_v).vio_tail) {
        uVar6 = *(uint *)xdrs->x_data;
        prVar3->rp_stat =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
        goto LAB_00111260;
      }
      _Var9 = (*xdrs->x_ops->x_getunit)(xdrs,&prVar3->rp_stat);
    }
    else {
      if (xVar5 != XDR_ENCODE) {
        return false;
      }
      rVar8 = prVar3->rp_stat;
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if (puVar1 <= (xdrs->x_v).vio_wrap) {
        *(reply_stat *)xdrs->x_data =
             rVar8 >> 0x18 | (rVar8 & 0xff0000) >> 8 | (rVar8 & 0xff00) << 8 | rVar8 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
        goto LAB_00111260;
      }
      _Var9 = (*xdrs->x_ops->x_putunit)(xdrs,rVar8);
    }
    if (_Var9 == false) {
      return false;
    }
  }
LAB_00111260:
  if (prVar3->rp_stat == MSG_ACCEPTED) {
    UNRECOVERED_JUMPTABLE = xdr_naccepted_reply;
  }
  else {
    pp_Var10 = &reply_dscrm[1].proc;
    do {
      UNRECOVERED_JUMPTABLE = *pp_Var10;
      if (UNRECOVERED_JUMPTABLE == (xdrproc_t)0x0) {
        return false;
      }
      pxVar4 = (xdr_discrim *)(pp_Var10 + -1);
      pp_Var10 = pp_Var10 + 2;
    } while (pxVar4->value != prVar3->rp_stat);
  }
  _Var9 = (*UNRECOVERED_JUMPTABLE)(xdrs,&(rmsg->ru).RM_rmb.ru);
  return _Var9;
}

Assistant:

bool
xdr_nreplymsg(XDR *xdrs, struct rpc_msg *rmsg)
{
	assert(xdrs != NULL);
	assert(rmsg != NULL);

	if (inline_xdr_u_int32_t(xdrs, &(rmsg->rm_xid))
	    && inline_xdr_enum(xdrs, (enum_t *) &(rmsg->rm_direction))
	    && (rmsg->rm_direction == REPLY))
		return (inline_xdr_union(xdrs,
					 (enum_t *)&(rmsg->rm_reply.rp_stat),
					 (void *)&(rmsg->rm_reply.ru),
					 reply_dscrm, NULL_xdrproc_t));
	return (false);
}